

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O0

easm_expr * getrbf(rbitfield *bf,ull *a,ull *m)

{
  ull uVar1;
  easm_expr *peVar2;
  byte bVar3;
  easm_expr *local_40;
  easm_expr *expr;
  int i;
  int pos;
  ull res;
  ull *m_local;
  ull *a_local;
  rbitfield *bf_local;
  
  _i = 0;
  expr._4_4_ = bf->shr;
  for (expr._0_4_ = 0; bVar3 = (byte)expr._4_4_, (uint)expr < 2; expr._0_4_ = (uint)expr + 1) {
    uVar1 = bf_(bf->sbf[(int)(uint)expr].pos,bf->sbf[(int)(uint)expr].len,a,m);
    _i = uVar1 << (bVar3 & 0x3f) | _i;
    expr._4_4_ = bf->sbf[(int)(uint)expr].len + expr._4_4_;
  }
  switch(bf->mode) {
  case RBF_UNSIGNED:
    break;
  case RBF_SIGNED:
    if ((_i & 1L << (bVar3 - 1 & 0x3f)) != 0) {
      _i = _i - (1L << (bVar3 & 0x3f));
    }
    break;
  case RBF_SLIGHTLY_SIGNED:
    if (((_i & 1L << (bVar3 - 1 & 0x3f)) != 0) && ((_i & 1L << (bVar3 - 2 & 0x3f)) != 0)) {
      _i = _i - (1L << (bVar3 & 0x3f));
    }
    break;
  case RBF_ULTRASIGNED:
    _i = _i - (1L << (bVar3 & 0x3f));
  }
  if (bf->pcrel == 0) {
    bf_local = (rbitfield *)easm_expr_num(EASM_EXPR_NUM,bf->addend + _i);
  }
  else {
    local_40 = easm_expr_simple(EASM_EXPR_POS);
    if (bf->pospreadd != 0) {
      peVar2 = easm_expr_num(EASM_EXPR_NUM,bf->pospreadd);
      local_40 = easm_expr_bin(EASM_EXPR_ADD,local_40,peVar2);
    }
    if (bf->shr != 0) {
      peVar2 = easm_expr_num(EASM_EXPR_NUM,-(1L << ((byte)bf->shr & 0x3f)));
      local_40 = easm_expr_bin(EASM_EXPR_AND,local_40,peVar2);
    }
    peVar2 = easm_expr_num(EASM_EXPR_NUM,_i);
    local_40 = easm_expr_bin(EASM_EXPR_ADD,local_40,peVar2);
    if (bf->addend != 0) {
      peVar2 = easm_expr_num(EASM_EXPR_NUM,bf->addend);
      local_40 = easm_expr_bin(EASM_EXPR_ADD,local_40,peVar2);
    }
    bf_local = (rbitfield *)local_40;
  }
  return (easm_expr *)bf_local;
}

Assistant:

struct easm_expr *getrbf(const struct rbitfield *bf, ull *a, ull *m) {
	ull res = 0;
	int pos = bf->shr;
	int i;
	for (i = 0; i < sizeof(bf->sbf) / sizeof(bf->sbf[0]); i++) {
		res |= BF(bf->sbf[i].pos, bf->sbf[i].len) << pos;
		pos += bf->sbf[i].len;
	}
	switch (bf->mode) {
		case RBF_UNSIGNED:
			break;
		case RBF_SIGNED:
			if (res & 1ull << (pos - 1))
				res -= 1ull << pos;
			break;
		case RBF_SLIGHTLY_SIGNED:
			if (res & 1ull << (pos - 1) && res & 1ull << (pos - 2))
				res -= 1ull << pos;
			break;
		case RBF_ULTRASIGNED:
			res -= 1ull << pos;
			break;
	}
	if (bf->pcrel) {
		struct easm_expr *expr = easm_expr_simple(EASM_EXPR_POS);
		if (bf->pospreadd)
			expr = easm_expr_bin(EASM_EXPR_ADD, expr, easm_expr_num(EASM_EXPR_NUM, bf->pospreadd));
		if (bf->shr)
			expr = easm_expr_bin(EASM_EXPR_AND, expr, easm_expr_num(EASM_EXPR_NUM, -(1ull << bf->shr)));
		expr = easm_expr_bin(EASM_EXPR_ADD, expr, easm_expr_num(EASM_EXPR_NUM, res));
		if (bf->addend)
			expr = easm_expr_bin(EASM_EXPR_ADD, expr, easm_expr_num(EASM_EXPR_NUM, bf->addend));
		return expr;
	} else {
		res += bf->addend;
		return easm_expr_num(EASM_EXPR_NUM, res);
	}
}